

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O1

void read1_cb(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 extraout_RAX;
  long lVar3;
  int iVar4;
  undefined8 in_R9;
  undefined1 auStack_98 [8];
  undefined8 uStack_90;
  code *pcStack_88;
  undefined1 auStack_80 [16];
  undefined1 auStack_70 [96];
  
  if (tcp == (uv_stream_t *)0x0) {
LAB_001737a9:
    read1_cb_cold_3();
  }
  else {
    if (-1 < nread) {
      if (nread != 0) {
        lVar3 = 0;
        do {
          if (buf->base[lVar3] != 'P') {
            read1_cb_cold_2();
            goto LAB_001737a9;
          }
          lVar3 = lVar3 + 1;
        } while (nread != lVar3);
      }
      return;
    }
    if (nread == -0xfff) {
      puts("GOT EOF");
      uv_close(tcp,close_cb);
      return;
    }
  }
  read1_cb_cold_1();
  iVar4 = 0x23a3;
  pcStack_88 = (code *)0x1737cd;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_80);
  if (iVar1 == 0) {
    pcStack_88 = (code *)0x1737da;
    uVar2 = uv_default_loop();
    iVar4 = 0x32ed08;
    pcStack_88 = (code *)0x1737e9;
    iVar1 = uv_timer_init(uVar2);
    if (iVar1 != 0) goto LAB_0017387c;
    pcStack_88 = (code *)0x1737f6;
    uVar2 = uv_default_loop();
    iVar4 = 0x32eda0;
    pcStack_88 = (code *)0x173805;
    iVar1 = uv_tcp_init(uVar2);
    if (iVar1 != 0) goto LAB_00173881;
    iVar4 = 0x32eda0;
    pcStack_88 = (code *)0x173824;
    iVar1 = uv_tcp_connect(auStack_70,&tcp_handle,auStack_80,connect_cb);
    if (iVar1 != 0) goto LAB_00173886;
    pcStack_88 = (code *)0x17382d;
    uVar2 = uv_default_loop();
    iVar4 = 0;
    pcStack_88 = (code *)0x173837;
    iVar1 = uv_run(uVar2);
    if (iVar1 != 0) goto LAB_0017388b;
    pcStack_88 = (code *)0x173840;
    uVar2 = uv_default_loop();
    pcStack_88 = (code *)0x173854;
    uv_walk(uVar2,close_walk_cb,0);
    iVar4 = 0;
    pcStack_88 = (code *)0x17385e;
    uv_run(uVar2);
    pcStack_88 = (code *)0x173863;
    uVar2 = uv_default_loop();
    pcStack_88 = (code *)0x17386b;
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    pcStack_88 = (code *)0x17387c;
    run_test_tcp_read_stop_cold_1();
LAB_0017387c:
    pcStack_88 = (code *)0x173881;
    run_test_tcp_read_stop_cold_2();
LAB_00173881:
    pcStack_88 = (code *)0x173886;
    run_test_tcp_read_stop_cold_3();
LAB_00173886:
    pcStack_88 = (code *)0x17388b;
    run_test_tcp_read_stop_cold_4();
LAB_0017388b:
    pcStack_88 = (code *)0x173890;
    run_test_tcp_read_stop_cold_5();
  }
  pcStack_88 = connect_cb;
  run_test_tcp_read_stop_cold_6();
  if (iVar4 == 0) {
    uStack_90 = (code *)0x1738b4;
    iVar1 = uv_timer_start(&timer_handle,timer_cb,0x32,0);
    if (iVar1 == 0) {
      uStack_90 = (code *)0x1738ce;
      iVar1 = uv_read_start(&tcp_handle,fail_cb);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_001738de;
    }
  }
  else {
    uStack_90 = (code *)0x1738d9;
    connect_cb_cold_1();
  }
  uStack_90 = (code *)0x1738de;
  connect_cb_cold_2();
LAB_001738de:
  uStack_90 = timer_cb;
  connect_cb_cold_3();
  _auStack_98 = uv_buf_init("PING",4);
  iVar1 = uv_write(&write_req,&tcp_handle,auStack_98,1,write_cb);
  if (iVar1 == 0) {
    iVar1 = uv_read_stop(&tcp_handle);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    timer_cb_cold_1();
  }
  timer_cb_cold_2();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-read-stop.c"
          ,0x1f,"0 && \"fail_cb called\"",in_R9,extraout_RAX);
  abort();
}

Assistant:

static void read1_cb(uv_stream_t* tcp, ssize_t nread, const uv_buf_t* buf) {
  int i;
  ASSERT(tcp != NULL);

  if (nread >= 0) {
    for (i = 0; i < nread; ++i)
      ASSERT(buf->base[i] == 'P');
  } else {
    ASSERT(nread == UV_EOF);
    printf("GOT EOF\n");
    uv_close((uv_handle_t*)tcp, close_cb);
  }
}